

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O2

void reorder_tool(tool_t *new_tool)

{
  int iVar1;
  tool_t *ptVar2;
  tool_t *ptVar3;
  tool_t **pptVar4;
  
  pptVar4 = &tools;
  ptVar3 = tools;
  if ((tools != (tool_t *)0x0) &&
     (iVar1 = (new_tool->config).priority, (tools->config).priority < iVar1)) {
    do {
      ptVar2 = ptVar3;
      ptVar3 = ptVar2->next_tool;
      if (ptVar3 == (tool_t *)0x0) break;
    } while ((ptVar3->config).priority < iVar1);
    pptVar4 = &ptVar2->next_tool;
  }
  new_tool->next_tool = ptVar3;
  *pptVar4 = new_tool;
  return;
}

Assistant:

void reorder_tool(tool_t* new_tool) {
  int new_priority = new_tool->config.priority;
  if(tools==NULL || tools->config.priority >= new_priority ){
     new_tool->next_tool = tools;
     tools = new_tool;
  }
  else{
     struct tool_t *cur = tools;
     while((cur->next_tool != NULL) && cur->next_tool->config.priority < new_priority){
        cur = cur->next_tool;
     }
     new_tool->next_tool = cur->next_tool;
     cur->next_tool = new_tool;
  }
}